

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

bool __thiscall
CoreML::Specification::Model::MergePartialFromCodedStream(Model *this,CodedInputStream *input)

{
  uint32 tag_00;
  undefined1 uVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  ModelDescription *value;
  PipelineClassifier *value_00;
  PipelineRegressor *value_01;
  Pipeline *value_02;
  GLMRegressor *value_03;
  SupportVectorRegressor *value_04;
  TreeEnsembleRegressor *value_05;
  NeuralNetworkRegressor *value_06;
  BayesianProbitRegressor *value_07;
  GLMClassifier *value_08;
  SupportVectorClassifier *value_09;
  TreeEnsembleClassifier *value_10;
  NeuralNetworkClassifier *value_11;
  KNearestNeighborsClassifier *value_12;
  NeuralNetwork *value_13;
  ItemSimilarityRecommender *value_14;
  CustomModel *value_15;
  LinkedModel *value_16;
  OneHotEncoder *value_17;
  Imputer *value_18;
  FeatureVectorizer *value_19;
  DictVectorizer *value_20;
  Scaler *value_21;
  CategoricalMapping *value_22;
  Normalizer *value_23;
  ArrayFeatureExtractor *value_24;
  NonMaximumSuppression *value_25;
  Identity *value_26;
  TextClassifier *value_27;
  WordTagger *value_28;
  VisionFeaturePrint *value_29;
  SoundAnalysisPreprocessing *value_30;
  Gazetteer *value_31;
  WordEmbedding *value_32;
  SerializedModel *value_33;
  bool local_8a;
  bool local_89;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  Model *this_local;
  bool local_3d;
  uint32 local_3c;
  bool local_35;
  uint32 tag_1;
  undefined4 uStack_30;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
  do {
    kMax1ByteVarint = 0x5dc2;
    tag_2 = 0;
    _first_byte_or_zero = input;
    if (input->buffer_ < input->buffer_end_) {
      tag_2 = (uint32)*input->buffer_;
      if ((char)*input->buffer_ < '\x01') {
        if ((input->buffer_end_ <= input->buffer_ + 1) ||
           ((*input->buffer_ & (input->buffer_[1] ^ 0xff)) < 0x80)) goto LAB_0020669a;
        uStack_30 = 0x3fff;
        tag_1 = (uint)input->buffer_[1] * 0x80 + (*input->buffer_ - 0x80);
        google::protobuf::io::CodedInputStream::Advance(input,2);
        local_8a = 0x3ffe < kMax1ByteVarint || tag_1 <= kMax1ByteVarint;
        local_35 = local_8a;
        pVar4 = std::make_pair<unsigned_int&,bool&>(&tag_1,&local_35);
        local_10 = pVar4.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
      }
      else {
        local_24 = 0x7f;
        kMax2ByteVarint = (uint32)*input->buffer_;
        google::protobuf::io::CodedInputStream::Advance(input,1);
        local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
        tag_3._3_1_ = local_89;
        pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
        local_10 = pVar4.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
      }
    }
    else {
LAB_0020669a:
      local_3c = google::protobuf::io::CodedInputStream::ReadTagFallback(input,tag_2);
      local_3d = local_3c - 1 < kMax1ByteVarint;
      pVar4 = std::make_pair<unsigned_int_const&,bool>(&local_3c,&local_3d);
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    tag_00 = local_10;
    if ((uStack_c & 1) == 0) {
LAB_00207405:
      if ((tag_00 == 0) ||
         (WVar3 = google::protobuf::internal::WireFormatLite::GetTagWireType(tag_00),
         WVar3 == WIRETYPE_END_GROUP)) {
        return true;
      }
      uVar1 = google::protobuf::internal::WireFormatLite::SkipField(input,tag_00);
    }
    else {
      iVar2 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
      if (iVar2 == 1) {
        if ((tag_00 & 0xff) != 8) goto LAB_00207405;
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (input,&this->specificationversion_);
      }
      else if (iVar2 == 2) {
        if ((tag_00 & 0xff) != 0x12) goto LAB_00207405;
        value = mutable_description(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::ModelDescription>(input,value);
      }
      else if (iVar2 == 10) {
        if ((tag_00 & 0xff) != 0x50) goto LAB_00207405;
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (input,&this->isupdatable_);
      }
      else if (iVar2 == 200) {
        if ((tag_00 & 0xff) != 0x42) goto LAB_00207405;
        value_00 = mutable_pipelineclassifier(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::PipelineClassifier>(input,value_00);
      }
      else if (iVar2 == 0xc9) {
        if ((tag_00 & 0xff) != 0x4a) goto LAB_00207405;
        value_01 = mutable_pipelineregressor(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::PipelineRegressor>(input,value_01);
      }
      else if (iVar2 == 0xca) {
        if ((tag_00 & 0xff) != 0x52) goto LAB_00207405;
        value_02 = mutable_pipeline(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::Pipeline>(input,value_02);
      }
      else if (iVar2 == 300) {
        if ((tag_00 & 0xff) != 0x62) goto LAB_00207405;
        value_03 = mutable_glmregressor(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::GLMRegressor>(input,value_03);
      }
      else if (iVar2 == 0x12d) {
        if ((tag_00 & 0xff) != 0x6a) goto LAB_00207405;
        value_04 = mutable_supportvectorregressor(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::SupportVectorRegressor>(input,value_04);
      }
      else if (iVar2 == 0x12e) {
        if ((tag_00 & 0xff) != 0x72) goto LAB_00207405;
        value_05 = mutable_treeensembleregressor(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::TreeEnsembleRegressor>(input,value_05);
      }
      else if (iVar2 == 0x12f) {
        if ((tag_00 & 0xff) != 0x7a) goto LAB_00207405;
        value_06 = mutable_neuralnetworkregressor(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::NeuralNetworkRegressor>(input,value_06);
      }
      else if (iVar2 == 0x130) {
        if ((tag_00 & 0xff) != 0x82) goto LAB_00207405;
        value_07 = mutable_bayesianprobitregressor(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::BayesianProbitRegressor>(input,value_07)
        ;
      }
      else if (iVar2 == 400) {
        if ((tag_00 & 0xff) != 0x82) goto LAB_00207405;
        value_08 = mutable_glmclassifier(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::GLMClassifier>(input,value_08);
      }
      else if (iVar2 == 0x191) {
        if ((tag_00 & 0xff) != 0x8a) goto LAB_00207405;
        value_09 = mutable_supportvectorclassifier(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::SupportVectorClassifier>(input,value_09)
        ;
      }
      else if (iVar2 == 0x192) {
        if ((tag_00 & 0xff) != 0x92) goto LAB_00207405;
        value_10 = mutable_treeensembleclassifier(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::TreeEnsembleClassifier>(input,value_10);
      }
      else if (iVar2 == 0x193) {
        if ((tag_00 & 0xff) != 0x9a) goto LAB_00207405;
        value_11 = mutable_neuralnetworkclassifier(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::NeuralNetworkClassifier>(input,value_11)
        ;
      }
      else if (iVar2 == 0x194) {
        if ((tag_00 & 0xff) != 0xa2) goto LAB_00207405;
        value_12 = mutable_knearestneighborsclassifier(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::KNearestNeighborsClassifier>
                          (input,value_12);
      }
      else if (iVar2 == 500) {
        if ((tag_00 & 0xff) != 0xa2) goto LAB_00207405;
        value_13 = mutable_neuralnetwork(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::NeuralNetwork>(input,value_13);
      }
      else if (iVar2 == 0x1f5) {
        if ((tag_00 & 0xff) != 0xaa) goto LAB_00207405;
        value_14 = mutable_itemsimilarityrecommender(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::ItemSimilarityRecommender>
                          (input,value_14);
      }
      else if (iVar2 == 0x22b) {
        if ((tag_00 & 0xff) != 0x5a) goto LAB_00207405;
        value_15 = mutable_custommodel(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::CustomModel>(input,value_15);
      }
      else if (iVar2 == 0x22c) {
        if ((tag_00 & 0xff) != 0x62) goto LAB_00207405;
        value_16 = mutable_linkedmodel(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::LinkedModel>(input,value_16);
      }
      else if (iVar2 == 600) {
        if ((tag_00 & 0xff) != 0xc2) goto LAB_00207405;
        value_17 = mutable_onehotencoder(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::OneHotEncoder>(input,value_17);
      }
      else if (iVar2 == 0x259) {
        if ((tag_00 & 0xff) != 0xca) goto LAB_00207405;
        value_18 = mutable_imputer(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::Imputer>(input,value_18);
      }
      else if (iVar2 == 0x25a) {
        if ((tag_00 & 0xff) != 0xd2) goto LAB_00207405;
        value_19 = mutable_featurevectorizer(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::FeatureVectorizer>(input,value_19);
      }
      else if (iVar2 == 0x25b) {
        if ((tag_00 & 0xff) != 0xda) goto LAB_00207405;
        value_20 = mutable_dictvectorizer(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::DictVectorizer>(input,value_20);
      }
      else if (iVar2 == 0x25c) {
        if ((tag_00 & 0xff) != 0xe2) goto LAB_00207405;
        value_21 = mutable_scaler(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::Scaler>(input,value_21);
      }
      else if (iVar2 == 0x25e) {
        if ((tag_00 & 0xff) != 0xf2) goto LAB_00207405;
        value_22 = mutable_categoricalmapping(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::CategoricalMapping>(input,value_22);
      }
      else if (iVar2 == 0x25f) {
        if ((tag_00 & 0xff) != 0xfa) goto LAB_00207405;
        value_23 = mutable_normalizer(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::Normalizer>(input,value_23);
      }
      else if (iVar2 == 0x261) {
        if ((tag_00 & 0xff) != 10) goto LAB_00207405;
        value_24 = mutable_arrayfeatureextractor(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::ArrayFeatureExtractor>(input,value_24);
      }
      else if (iVar2 == 0x262) {
        if ((tag_00 & 0xff) != 0x12) goto LAB_00207405;
        value_25 = mutable_nonmaximumsuppression(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::NonMaximumSuppression>(input,value_25);
      }
      else if (iVar2 == 900) {
        if ((tag_00 & 0xff) != 0x22) goto LAB_00207405;
        value_26 = mutable_identity(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::Identity>(input,value_26);
      }
      else if (iVar2 == 2000) {
        if ((tag_00 & 0xff) != 0x82) goto LAB_00207405;
        value_27 = mutable_textclassifier(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::CoreMLModels::TextClassifier>
                          (input,value_27);
      }
      else if (iVar2 == 0x7d1) {
        if ((tag_00 & 0xff) != 0x8a) goto LAB_00207405;
        value_28 = mutable_wordtagger(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::CoreMLModels::WordTagger>
                          (input,value_28);
      }
      else if (iVar2 == 0x7d2) {
        if ((tag_00 & 0xff) != 0x92) goto LAB_00207405;
        value_29 = mutable_visionfeatureprint(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::CoreMLModels::VisionFeaturePrint>
                          (input,value_29);
      }
      else if (iVar2 == 0x7d3) {
        if ((tag_00 & 0xff) != 0x9a) goto LAB_00207405;
        value_30 = mutable_soundanalysispreprocessing(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing>
                          (input,value_30);
      }
      else if (iVar2 == 0x7d4) {
        if ((tag_00 & 0xff) != 0xa2) goto LAB_00207405;
        value_31 = mutable_gazetteer(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::CoreMLModels::Gazetteer>(input,value_31)
        ;
      }
      else if (iVar2 == 0x7d5) {
        if ((tag_00 & 0xff) != 0xaa) goto LAB_00207405;
        value_32 = mutable_wordembedding(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::CoreMLModels::WordEmbedding>
                          (input,value_32);
      }
      else {
        if ((iVar2 != 3000) || ((tag_00 & 0xff) != 0xc2)) goto LAB_00207405;
        value_33 = mutable_serializedmodel(this);
        uVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::SerializedModel>(input,value_33);
      }
    }
    if (!(bool)uVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool Model::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.Model)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(24002u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int32 specificationVersion = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &specificationversion_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ModelDescription description = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_description()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool isUpdatable = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &isupdatable_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.PipelineClassifier pipelineClassifier = 200;
      case 200: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1602u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_pipelineclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.PipelineRegressor pipelineRegressor = 201;
      case 201: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1610u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_pipelineregressor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Pipeline pipeline = 202;
      case 202: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1618u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_pipeline()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.GLMRegressor glmRegressor = 300;
      case 300: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(2402u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_glmregressor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SupportVectorRegressor supportVectorRegressor = 301;
      case 301: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(2410u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_supportvectorregressor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.TreeEnsembleRegressor treeEnsembleRegressor = 302;
      case 302: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(2418u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_treeensembleregressor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NeuralNetworkRegressor neuralNetworkRegressor = 303;
      case 303: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(2426u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_neuralnetworkregressor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.BayesianProbitRegressor bayesianProbitRegressor = 304;
      case 304: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(2434u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bayesianprobitregressor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.GLMClassifier glmClassifier = 400;
      case 400: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(3202u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_glmclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SupportVectorClassifier supportVectorClassifier = 401;
      case 401: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(3210u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_supportvectorclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.TreeEnsembleClassifier treeEnsembleClassifier = 402;
      case 402: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(3218u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_treeensembleclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NeuralNetworkClassifier neuralNetworkClassifier = 403;
      case 403: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(3226u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_neuralnetworkclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.KNearestNeighborsClassifier kNearestNeighborsClassifier = 404;
      case 404: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(3234u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_knearestneighborsclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NeuralNetwork neuralNetwork = 500;
      case 500: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4002u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_neuralnetwork()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ItemSimilarityRecommender itemSimilarityRecommender = 501;
      case 501: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4010u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_itemsimilarityrecommender()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CustomModel customModel = 555;
      case 555: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4442u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_custommodel()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.LinkedModel linkedModel = 556;
      case 556: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4450u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_linkedmodel()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.OneHotEncoder oneHotEncoder = 600;
      case 600: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_onehotencoder()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Imputer imputer = 601;
      case 601: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_imputer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.FeatureVectorizer featureVectorizer = 602;
      case 602: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4818u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_featurevectorizer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.DictVectorizer dictVectorizer = 603;
      case 603: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4826u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_dictvectorizer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Scaler scaler = 604;
      case 604: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4834u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_scaler()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CategoricalMapping categoricalMapping = 606;
      case 606: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4850u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_categoricalmapping()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Normalizer normalizer = 607;
      case 607: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4858u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_normalizer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ArrayFeatureExtractor arrayFeatureExtractor = 609;
      case 609: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4874u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_arrayfeatureextractor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NonMaximumSuppression nonMaximumSuppression = 610;
      case 610: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4882u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_nonmaximumsuppression()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Identity identity = 900;
      case 900: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(7202u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_identity()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CoreMLModels.TextClassifier textClassifier = 2000;
      case 2000: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16002u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_textclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CoreMLModels.WordTagger wordTagger = 2001;
      case 2001: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16010u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_wordtagger()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CoreMLModels.VisionFeaturePrint visionFeaturePrint = 2002;
      case 2002: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16018u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_visionfeatureprint()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing soundAnalysisPreprocessing = 2003;
      case 2003: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16026u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_soundanalysispreprocessing()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CoreMLModels.Gazetteer gazetteer = 2004;
      case 2004: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16034u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_gazetteer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CoreMLModels.WordEmbedding wordEmbedding = 2005;
      case 2005: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16042u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_wordembedding()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SerializedModel serializedModel = 3000;
      case 3000: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24002u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_serializedmodel()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.Model)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.Model)
  return false;
#undef DO_
}